

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall
front::syntax::SyntaxAnalyze::gm_func_param
          (SyntaxAnalyze *this,
          vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
          *params,int funcLayerNum,
          vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *genValues)

{
  bool bVar1;
  int iVar2;
  Word *name_00;
  element_type *peVar3;
  element_type *peVar4;
  irGenerator *in_RDI;
  SharedExNdPtr genNode;
  SharedSyPtr genValue;
  SharedExNdPtr dimension;
  SharedExNdPtr holderDimension;
  SharedSyPtr symbol;
  string name;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  ArraySymbol *in_stack_fffffffffffffca0;
  Token in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  SyntaxAnalyze *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  ExpressNode *in_stack_fffffffffffffcc0;
  undefined1 *in_stack_fffffffffffffcd8;
  element_type *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  IntSymbol *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  ArraySymbol *in_stack_fffffffffffffd00;
  element_type *in_stack_fffffffffffffd38;
  SymbolTable *in_stack_fffffffffffffd40;
  SyntaxAnalyze *this_00;
  int in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  SymbolKind kind;
  string local_258 [32];
  string local_238 [55];
  undefined1 local_201;
  string local_200 [12];
  Token in_stack_fffffffffffffe0c;
  SyntaxAnalyze *in_stack_fffffffffffffe10;
  SyntaxAnalyze *in_stack_fffffffffffffe28;
  undefined1 local_1d0 [103];
  undefined1 local_169;
  string local_168 [64];
  undefined1 local_128 [119];
  undefined1 local_b1;
  string local_a0 [32];
  string local_80 [64];
  string local_40 [64];
  
  std::__cxx11::string::string(local_40);
  std::shared_ptr<front::symbol::Symbol>::shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2abd40);
  match_one_word(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  match_one_word(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  name_00 = get_least_matched_word((SyntaxAnalyze *)0x2abd72);
  word::Word::get_self_abi_cxx11_
            ((Word *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::__cxx11::string::operator=(local_40,local_80);
  std::__cxx11::string::~string(local_80);
  bVar1 = try_word(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
  iVar2 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  kind = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd94);
  if (bVar1) {
    operator_new(0x78);
    local_b1 = 1;
    std::__cxx11::string::string(local_a0,local_40);
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (SharedSyPtr *)in_stack_fffffffffffffcf0,
               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0),
               SUB81((ulong)in_stack_fffffffffffffce8 >> 0x10,0));
    local_b1 = 0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffcb0,
               (ArraySymbol *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::shared_ptr<front::symbol::Symbol>::~shared_ptr
              ((shared_ptr<front::symbol::Symbol> *)0x2abe8c);
    std::__cxx11::string::~string(local_a0);
    match_one_word(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
    operator_new(0x48);
    express::ExpressNode::ExpressNode(in_stack_fffffffffffffcc0);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffca0,
               (ExpressNode *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    peVar3 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2abefc);
    peVar3->_type = VAR;
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2abf2c);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffca0,
               (shared_ptr<front::express::ExpressNode> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    front::symbol::ArraySymbol::addDimension
              (in_stack_fffffffffffffca0,
               (SharedExNdPtr *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2abf75);
    std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
              ((shared_ptr<front::symbol::ArraySymbol> *)0x2abf82);
    match_one_word(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
    while (bVar1 = try_word(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                            in_stack_fffffffffffffca8), bVar1) {
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2abfd5);
      match_one_word(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      gm_exp(in_stack_fffffffffffffe28);
      this_00 = (SyntaxAnalyze *)(local_128 + 0x20);
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffca0,
                 (shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2ac02a);
      match_one_word(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      peVar3 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ac04b);
      iVar2 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      if (peVar3->_type == CNS) {
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  ((shared_ptr<front::symbol::Symbol> *)
                   CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        in_stack_fffffffffffffd38 =
             std::
             __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ac07e);
        in_stack_fffffffffffffd40 = (SymbolTable *)local_128;
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffca0,
                   (shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        front::symbol::ArraySymbol::addDimension
                  (in_stack_fffffffffffffca0,
                   (SharedExNdPtr *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2ac0c7);
        std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                  ((shared_ptr<front::symbol::ArraySymbol> *)0x2ac0d4);
      }
      else {
        std::shared_ptr<front::symbol::Symbol>::shared_ptr
                  ((shared_ptr<front::symbol::Symbol> *)0x2ac23f);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2ac24c);
        operator_new(0x40);
        local_169 = 1;
        hp_gen_save_value_abi_cxx11_(this_00);
        front::symbol::IntSymbol::IntSymbol
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                   (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffce0 >> 0x18,0),iVar2);
        local_169 = 0;
        std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
        reset<front::symbol::IntSymbol>
                  ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                   in_stack_fffffffffffffcb0,
                   (IntSymbol *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        std::__cxx11::string::~string(local_168);
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ac2ee);
        std::
        pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::shared_ptr<front::symbol::Symbol>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffcc0,
                   (shared_ptr<front::symbol::Symbol> *)
                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcb0);
        std::
        vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffca0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::
        pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffca0);
        std::shared_ptr<front::symbol::Symbol>::shared_ptr
                  ((shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffffca0,
                   (shared_ptr<front::symbol::Symbol> *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        symbolTable::SymbolTable::push_symbol
                  (in_stack_fffffffffffffd40,(SharedSyPtr *)in_stack_fffffffffffffd38);
        std::shared_ptr<front::symbol::Symbol>::~shared_ptr
                  ((shared_ptr<front::symbol::Symbol> *)0x2ac37f);
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ac391);
        peVar3->_type = VAR;
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ac3a1);
        peVar3->_operation = ASSIGN;
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ac3b2);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffca0,
                   (shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        express::ExpressNode::addChild
                  ((ExpressNode *)in_stack_fffffffffffffca0,
                   (SharedExNdPtr *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2ac3ef);
        peVar4 = std::
                 __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ac3fc);
        in_stack_fffffffffffffcf0 = (IntSymbol *)&peVar4->_name;
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ac412);
        std::__cxx11::string::operator=
                  ((string *)&peVar3->_name,(string *)in_stack_fffffffffffffcf0);
        in_stack_fffffffffffffcd8 = local_1d0;
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  ((shared_ptr<front::symbol::Symbol> *)
                   CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        in_stack_fffffffffffffce0 =
             std::
             __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ac449);
        in_stack_fffffffffffffce8 = (string *)&stack0xfffffffffffffe20;
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffca0,
                   (shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        front::symbol::ArraySymbol::addDimension
                  (in_stack_fffffffffffffca0,
                   (SharedExNdPtr *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2ac486);
        std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                  ((shared_ptr<front::symbol::ArraySymbol> *)0x2ac493);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2ac4a0);
        std::shared_ptr<front::symbol::Symbol>::~shared_ptr
                  ((shared_ptr<front::symbol::Symbol> *)0x2ac4ad);
      }
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2ac5e5);
    }
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ac606);
  }
  else {
    operator_new(0x40);
    local_201 = 1;
    std::__cxx11::string::string(local_200,local_40);
    front::symbol::IntSymbol::IntSymbol
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
               (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffce0 >> 0x18,0),iVar2);
    local_201 = 0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffcb0,
               (IntSymbol *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string(local_200);
  }
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::push_back((vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
               *)in_stack_fffffffffffffcb0,
              (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  std::shared_ptr<front::symbol::Symbol>::shared_ptr
            ((shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffffca0,
             (shared_ptr<front::symbol::Symbol> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  symbolTable::SymbolTable::push_symbol
            (in_stack_fffffffffffffd40,(SharedSyPtr *)in_stack_fffffffffffffd38);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2ac752)
  ;
  peVar4 = std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ac75f);
  iVar2 = (**peVar4->_vptr_Symbol)();
  if (iVar2 == 0) {
    std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2ac870);
    front::symbol::Symbol::getName_abi_cxx11_
              ((Symbol *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    peVar4 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ac88f);
    front::symbol::Symbol::getId(peVar4);
    irGenerator::irGenerator::ir_declare_param
              (in_RDI,(string *)name_00,kind,in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_258);
  }
  else if (iVar2 == 2) {
    std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2ac7d0);
    front::symbol::Symbol::getName_abi_cxx11_
              ((Symbol *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    peVar4 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ac7ef);
    front::symbol::Symbol::getId(peVar4);
    irGenerator::irGenerator::ir_declare_param
              (in_RDI,(string *)name_00,kind,in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_238);
  }
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2ac8f8)
  ;
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void SyntaxAnalyze::gm_func_param(
    vector<SharedSyPtr> &params, int funcLayerNum,
    vector<std::pair<SharedSyPtr, string>> &genValues) {
  string name;
  SharedSyPtr symbol;

  match_one_word(Token::INTTK);
  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 funcLayerNum + 1, false, true));
    match_one_word(Token::LBRACK);

    SharedExNdPtr holderDimension = SharedExNdPtr(new ExpressNode());
    holderDimension->_type = NodeType::VAR;
    std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(
        SharedExNdPtr(holderDimension));

    match_one_word(Token::RBRACK);

    while (try_word(1, Token::LBRACK)) {
      SharedExNdPtr dimension;
      match_one_word(Token::LBRACK);
      dimension = gm_exp();
      match_one_word(Token::RBRACK);
      if (dimension->_type == NodeType::CNS) {
        std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(dimension);
      } else {
        SharedSyPtr genValue;
        SharedExNdPtr genNode;

        genValue.reset(
            new IntSymbol(hp_gen_save_value(), funcLayerNum + 1, false));
        genValues.push_back(
            std::pair<SharedSyPtr, string>(genValue, dimension->_name));
        symbolTable.push_symbol(genValue);

        genNode->_type = NodeType::VAR;
        genNode->_operation = OperationType::ASSIGN;
        genNode->addChild(dimension);
        genNode->_name = genValue->_name;
        std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(genNode);
      }
    }
  } else {
    symbol.reset(new IntSymbol(name, funcLayerNum + 1, false));
  }
  params.push_back(symbol);

  symbolTable.push_symbol(symbol);
  switch (symbol->kind()) {
    case SymbolKind::Array:
      irGenerator.ir_declare_param(symbol->getName(), SymbolKind::Ptr,
                                   symbol->getId());
      break;
    case SymbolKind::INT:
      irGenerator.ir_declare_param(symbol->getName(), SymbolKind::INT,
                                   symbol->getId());
      break;
    default:
      break;
  }
}